

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_bit_decoder.cc
# Opt level: O2

void __thiscall
draco::RAnsBitDecoder::DecodeLeastSignificantBits32(RAnsBitDecoder *this,int nbits,uint32_t *value)

{
  uint32_t result;
  uint32_t uVar1;
  bool bVar2;
  
  uVar1 = 0;
  while (bVar2 = nbits != 0, nbits = nbits + -1, bVar2) {
    bVar2 = DecodeNextBit(this);
    uVar1 = (uint)bVar2 + uVar1 * 2;
  }
  *value = uVar1;
  return;
}

Assistant:

void RAnsBitDecoder::DecodeLeastSignificantBits32(int nbits, uint32_t *value) {
  DRACO_DCHECK_EQ(true, nbits <= 32);
  DRACO_DCHECK_EQ(true, nbits > 0);

  uint32_t result = 0;
  while (nbits) {
    result = (result << 1) + DecodeNextBit();
    --nbits;
  }
  *value = result;
}